

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

callback<void_()> * __thiscall
booster::callback<void()>::operator=
          (callback<void()> *this,unique_ptr<mycall,_std::default_delete<mycall>_> *c)

{
  mycall *rhs;
  
  intrusive_ptr<booster::callable<void_()>_>::operator=
            ((intrusive_ptr<booster::callable<void_()>_> *)this,(callable<void_()> *)0x0);
  rhs = (c->_M_t).super___uniq_ptr_impl<mycall,_std::default_delete<mycall>_>._M_t.
        super__Tuple_impl<0UL,_mycall_*,_std::default_delete<mycall>_>.
        super__Head_base<0UL,_mycall_*,_false>._M_head_impl;
  (c->_M_t).super___uniq_ptr_impl<mycall,_std::default_delete<mycall>_>._M_t.
  super__Tuple_impl<0UL,_mycall_*,_std::default_delete<mycall>_>.
  super__Head_base<0UL,_mycall_*,_false>._M_head_impl = (mycall *)0x0;
  intrusive_ptr<booster::callable<void_()>_>::operator=
            ((intrusive_ptr<booster::callable<void_()>_> *)this,&rhs->super_callable<void_()>);
  return (callback<void_()> *)this;
}

Assistant:

callback const &operator=(std::unique_ptr<Call> c)		
		{ call_ptr = 0; call_ptr = c.release(); return *this; }